

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall Pathie::Path::join(Path *__return_storage_ptr__,Path *this,Path *path)

{
  Path local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [39];
  undefined1 local_21;
  Path *local_20;
  Path *path_local;
  Path *this_local;
  Path *p;
  
  local_21 = 0;
  local_20 = path;
  path_local = this;
  this_local = __return_storage_ptr__;
  std::operator+(local_68,(char *)this);
  str_abi_cxx11_(&local_88);
  std::operator+(local_48,local_68);
  Path(__return_storage_ptr__,local_48);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Path Path::join(Path path) const
{
  Path p(m_path + "/" + path.str());
  return p;
}